

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestLogCompare.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  exception *e;
  bool compareOk;
  undefined1 local_40 [8];
  CommandLine cmdLine;
  char **argv_local;
  int argc_local;
  
  cmdLine.filenames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)argv;
  CommandLine::CommandLine((CommandLine *)local_40);
  bVar1 = parseCommandLine((CommandLine *)local_40,argc,
                           (char **)cmdLine.filenames.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (bVar1) {
    bVar1 = runCompare((CommandLine *)local_40,(ostream *)&std::cout);
    argv_local._4_4_ = -1;
    if (bVar1) {
      argv_local._4_4_ = 0;
    }
  }
  else {
    argv_local._4_4_ = -1;
  }
  CommandLine::~CommandLine((CommandLine *)local_40);
  return argv_local._4_4_;
}

Assistant:

int main (int argc, const char* const* argv)
{
	CommandLine cmdLine;

	if (!parseCommandLine(cmdLine, argc, argv))
		return -1;

	try
	{
		bool compareOk = runCompare(cmdLine, std::cout);
		return compareOk ? 0 : -1;
	}
	catch (const std::exception& e)
	{
		printf("FATAL ERROR: %s\n", e.what());
		return -1;
	}
}